

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O2

char * p2sc_get_temp(char *key)

{
  int iVar1;
  p2sc_keyfile_t *k;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  undefined8 uVar6;
  
  k = p2sc_open_keyfile("/p2sc/conf/global.ini");
  pcVar2 = p2sc_get_keyvalue(k,"dir","top");
  pcVar3 = p2sc_get_keyvalue(k,"dir",key);
  pcVar4 = p2sc_get_string("runid");
  pcVar4 = (char *)g_build_filename(pcVar2,pcVar3,pcVar4,0);
  iVar1 = g_mkdir_with_parents(pcVar4,0x1ed);
  if (iVar1 == 0) {
    g_free(pcVar3);
    g_free(pcVar2);
    return pcVar4;
  }
  piVar5 = __errno_location();
  uVar6 = g_strerror(*piVar5);
  _p2sc_msg("p2sc_get_temp",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,0x55,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,"mkdir(%s): %s",
            pcVar4,uVar6);
  exit(1);
}

Assistant:

char *p2sc_get_temp(const char *key) {
    p2sc_keyfile_t *kf = p2sc_open_keyfile(P2SC_GLOBAL_INI);

    char *top = p2sc_get_keyvalue(kf, "dir", "top");
    char *dir = p2sc_get_keyvalue(kf, "dir", key);
    const char *rid = p2sc_get_string("runid");
    char *tmp = g_build_filename(top, dir, rid, NULL);

    if (g_mkdir_with_parents(tmp, 0755))
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "mkdir(%s): %s", tmp, g_strerror(errno));

    g_free(dir);
    g_free(top);

    return tmp;
}